

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drink_factory.hpp
# Opt level: O0

void __thiscall DrinkFactory::DrinkFactory(DrinkFactory *this)

{
  unique_ptr<AbstractHotDrinkFactory,std::default_delete<AbstractHotDrinkFactory>> *puVar1;
  allocator<char> local_79;
  key_type local_78;
  unique_ptr<TeaFactory,_std::default_delete<TeaFactory>_> local_58;
  allocator<char> local_49;
  key_type local_48;
  unique_ptr<CoffeeFactory,_std::default_delete<CoffeeFactory>_> local_18;
  DrinkFactory *local_10;
  DrinkFactory *this_local;
  
  local_10 = this;
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<AbstractHotDrinkFactory,_std::default_delete<AbstractHotDrinkFactory>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<AbstractHotDrinkFactory,_std::default_delete<AbstractHotDrinkFactory>_>_>_>_>
  ::unordered_map(&this->factories);
  std::make_unique<CoffeeFactory>();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"coffee",&local_49);
  puVar1 = (unique_ptr<AbstractHotDrinkFactory,std::default_delete<AbstractHotDrinkFactory>> *)
           std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<AbstractHotDrinkFactory,_std::default_delete<AbstractHotDrinkFactory>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<AbstractHotDrinkFactory,_std::default_delete<AbstractHotDrinkFactory>_>_>_>_>
           ::operator[](&this->factories,&local_48);
  std::unique_ptr<AbstractHotDrinkFactory,std::default_delete<AbstractHotDrinkFactory>>::operator=
            (puVar1,&local_18);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator(&local_49);
  std::unique_ptr<CoffeeFactory,_std::default_delete<CoffeeFactory>_>::~unique_ptr(&local_18);
  std::make_unique<TeaFactory>();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"tea",&local_79);
  puVar1 = (unique_ptr<AbstractHotDrinkFactory,std::default_delete<AbstractHotDrinkFactory>> *)
           std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<AbstractHotDrinkFactory,_std::default_delete<AbstractHotDrinkFactory>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<AbstractHotDrinkFactory,_std::default_delete<AbstractHotDrinkFactory>_>_>_>_>
           ::operator[](&this->factories,&local_78);
  std::unique_ptr<AbstractHotDrinkFactory,std::default_delete<AbstractHotDrinkFactory>>::operator=
            (puVar1,&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  std::allocator<char>::~allocator(&local_79);
  std::unique_ptr<TeaFactory,_std::default_delete<TeaFactory>_>::~unique_ptr(&local_58);
  return;
}

Assistant:

DrinkFactory()
	{
		factories["coffee"] = std::make_unique<CoffeeFactory>();
		factories["tea"] = std::make_unique<TeaFactory>();
	}